

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

iterator * __thiscall ghc::filesystem::path::iterator::operator++(iterator *this)

{
  bool bVar1;
  const_iterator cVar2;
  reference pcVar3;
  iterator *in_RDI;
  iterator *in_stack_00000010;
  const_iterator *in_stack_00000040;
  iterator *in_stack_00000048;
  uint7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  
  cVar2 = increment(in_stack_00000048,in_stack_00000040);
  (in_RDI->_iter)._M_current = cVar2._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&in_RDI->_first,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffdf = false;
    if (bVar1) {
      bVar1 = __gnu_cxx::operator!=
                        (&in_RDI->_first,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(ulong)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffdf = false;
      if (bVar1) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&in_RDI->_iter);
        in_stack_ffffffffffffffdf = false;
        if (*pcVar3 == '/') {
          in_stack_ffffffffffffffe8 =
               __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(in_stack_ffffffffffffffe8._M_current,(difference_type)in_RDI);
          in_stack_ffffffffffffffdf =
               __gnu_cxx::operator!=
                         (&in_RDI->_first,
                          (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
        }
      }
    }
    if ((bool)in_stack_ffffffffffffffdf == false) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&in_RDI->_iter);
  }
  updateCurrent(in_stack_00000010);
  return in_RDI;
}

Assistant:

GHC_INLINE path::iterator& path::iterator::operator++()
{
    _iter = increment(_iter);
    while (_iter != _last &&                // we didn't reach the end
           _iter != _root &&                // this is not a root position
           *_iter == preferred_separator &&  // we are on a separator
           (_iter + 1) != _last             // the slash is not the last char
    ) {
        ++_iter;
    }
    updateCurrent();
    return *this;
}